

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_filter.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::add_rule
          (filter_impl<std::array<unsigned_char,_16UL>_> *this,array<unsigned_char,_16UL> first,
          array<unsigned_char,_16UL> last,uint32_t flags)

{
  _Rb_tree_header *p_Var1;
  char *pcVar2;
  _Base_ptr p_Var3;
  array<unsigned_char,_16UL> addr;
  _Alloc_node _Var4;
  _Base_ptr p_Var5;
  uint uVar6;
  iterator __position;
  iterator __last;
  long lVar7;
  const_iterator __first;
  ulong uVar8;
  uint32_t uVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  array<unsigned_char,_16UL> addr_00;
  array<unsigned_char,_16UL> addr_01;
  array<unsigned_char,_16UL> tmp;
  _Alloc_node __an;
  char cStack_99;
  _Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>_>
  *local_98;
  _Base_ptr p_Stack_90;
  uint32_t local_84;
  _Base_ptr local_80;
  _Alloc_node local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  
  uStack_60 = last._M_elems._8_8_;
  local_68 = last._M_elems._0_8_;
  local_80 = first._M_elems._8_8_;
  addr_00._M_elems._0_8_ = first._M_elems._0_8_;
  local_58 = addr_00._M_elems._0_8_;
  uStack_50 = local_80;
  range::range((range *)&local_98,first,0);
  __position = ::std::
               _Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>_>
               ::upper_bound((_Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>_>
                              *)this,(range *)&local_98);
  range::range((range *)&local_98,last,0);
  __last = ::std::
           _Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>_>
           ::upper_bound((_Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>_>
                          *)this,(range *)&local_98);
  p_Var3 = (this->m_access_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (__position._M_node != p_Var3) {
    __position._M_node = (_Base_ptr)::std::_Rb_tree_decrement(__position._M_node);
  }
  uVar9 = *(uint32_t *)&__position._M_node[1]._M_left;
  lVar7 = ::std::_Rb_tree_decrement(__last._M_node);
  local_84 = *(uint32_t *)(lVar7 + 0x30);
  auVar12[0] = -((undefined1)local_58 == (char)__position._M_node[1]._M_color);
  auVar12[1] = -(local_58._1_1_ == *(byte *)((long)&__position._M_node[1]._M_color + 1));
  auVar12[2] = -(local_58._2_1_ == *(byte *)((long)&__position._M_node[1]._M_color + 2));
  auVar12[3] = -(local_58._3_1_ == *(byte *)((long)&__position._M_node[1]._M_color + 3));
  auVar12[4] = -(local_58._4_1_ == __position._M_node[1].field_0x4);
  auVar12[5] = -(local_58._5_1_ == __position._M_node[1].field_0x5);
  auVar12[6] = -(local_58._6_1_ == __position._M_node[1].field_0x6);
  auVar12[7] = -(local_58._7_1_ == __position._M_node[1].field_0x7);
  auVar12[8] = -((char)uStack_50 == *(char *)&__position._M_node[1]._M_parent);
  auVar12[9] = -(uStack_50._1_1_ == *(char *)((long)&__position._M_node[1]._M_parent + 1));
  auVar12[10] = -(uStack_50._2_1_ == *(char *)((long)&__position._M_node[1]._M_parent + 2));
  auVar12[0xb] = -(uStack_50._3_1_ == *(char *)((long)&__position._M_node[1]._M_parent + 3));
  auVar12[0xc] = -(uStack_50._4_1_ == *(char *)((long)&__position._M_node[1]._M_parent + 4));
  auVar12[0xd] = -(uStack_50._5_1_ == *(char *)((long)&__position._M_node[1]._M_parent + 5));
  auVar12[0xe] = -(uStack_50._6_1_ == *(char *)((long)&__position._M_node[1]._M_parent + 6));
  auVar12[0xf] = -(uStack_50._7_1_ == *(char *)((long)&__position._M_node[1]._M_parent + 7));
  if (uVar9 == flags ||
      (ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe | (ushort)(auVar12[0xf] >> 7) << 0xf)
      == 0xffff) {
    if ((__position._M_node != p_Var3) &&
       (lVar7 = ::std::_Rb_tree_decrement(__position._M_node), *(uint32_t *)(lVar7 + 0x30) == flags)
       ) {
      __position._M_node = (_Base_ptr)::std::_Rb_tree_decrement(__position._M_node);
      uVar9 = *(uint32_t *)&__position._M_node[1]._M_left;
    }
  }
  else {
    addr_00._M_elems._8_8_ = local_80;
    range::range((range *)&local_98,addr_00,flags);
    local_78._M_t =
         (_Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>_>
          *)this;
    __position = ::std::
                 _Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>>
                 ::
                 _M_insert_unique_<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,std::_Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>>::_Alloc_node>
                           ((_Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>>
                             *)this,__position._M_node,(range *)&local_98,&local_78);
  }
  if (__position._M_node != __last._M_node) {
    __first._M_node = (_Base_ptr)::std::_Rb_tree_increment(__position._M_node);
    ::std::
    _Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>_>
    ::_M_erase_aux((_Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>_>
                    *)this,__first,(const_iterator)__last._M_node);
  }
  auVar13[0] = -((undefined1)local_58 == (char)__position._M_node[1]._M_color);
  auVar13[1] = -(local_58._1_1_ == *(byte *)((long)&__position._M_node[1]._M_color + 1));
  auVar13[2] = -(local_58._2_1_ == *(byte *)((long)&__position._M_node[1]._M_color + 2));
  auVar13[3] = -(local_58._3_1_ == *(byte *)((long)&__position._M_node[1]._M_color + 3));
  auVar13[4] = -(local_58._4_1_ == __position._M_node[1].field_0x4);
  auVar13[5] = -(local_58._5_1_ == __position._M_node[1].field_0x5);
  auVar13[6] = -(local_58._6_1_ == __position._M_node[1].field_0x6);
  auVar13[7] = -(local_58._7_1_ == __position._M_node[1].field_0x7);
  auVar13[8] = -((char)uStack_50 == *(char *)&__position._M_node[1]._M_parent);
  auVar13[9] = -(uStack_50._1_1_ == *(char *)((long)&__position._M_node[1]._M_parent + 1));
  auVar13[10] = -(uStack_50._2_1_ == *(char *)((long)&__position._M_node[1]._M_parent + 2));
  auVar13[0xb] = -(uStack_50._3_1_ == *(char *)((long)&__position._M_node[1]._M_parent + 3));
  auVar13[0xc] = -(uStack_50._4_1_ == *(char *)((long)&__position._M_node[1]._M_parent + 4));
  auVar13[0xd] = -(uStack_50._5_1_ == *(char *)((long)&__position._M_node[1]._M_parent + 5));
  auVar13[0xe] = -(uStack_50._6_1_ == *(char *)((long)&__position._M_node[1]._M_parent + 6));
  auVar13[0xf] = -(uStack_50._7_1_ == *(char *)((long)&__position._M_node[1]._M_parent + 7));
  if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe | (ushort)(auVar13[0xf] >> 7) << 0xf)
      == 0xffff) {
    *(undefined8 *)(__position._M_node + 1) = local_58;
    __position._M_node[1]._M_parent = uStack_50;
    *(uint32_t *)&__position._M_node[1]._M_left = flags;
  }
  else if (uVar9 != flags) {
    addr_01._M_elems._8_8_ = local_80;
    addr_01._M_elems[0] = (char)addr_00._M_elems._0_8_;
    addr_01._M_elems[1] = (char)((ulong)addr_00._M_elems._0_8_ >> 8);
    addr_01._M_elems[2] = (char)((ulong)addr_00._M_elems._0_8_ >> 0x10);
    addr_01._M_elems[3] = (char)((ulong)addr_00._M_elems._0_8_ >> 0x18);
    addr_01._M_elems[4] = (char)((ulong)addr_00._M_elems._0_8_ >> 0x20);
    addr_01._M_elems[5] = (char)((ulong)addr_00._M_elems._0_8_ >> 0x28);
    addr_01._M_elems[6] = (char)((ulong)addr_00._M_elems._0_8_ >> 0x30);
    addr_01._M_elems[7] = (char)((ulong)addr_00._M_elems._0_8_ >> 0x38);
    range::range((range *)&local_98,addr_01,flags);
    local_78._M_t =
         (_Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>_>
          *)this;
    ::std::
    _Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>>
    ::
    _M_insert_unique_<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,std::_Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>>::_Alloc_node>
              ((_Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>>
                *)this,(const_iterator)__position._M_node,(range *)&local_98,&local_78);
  }
  p_Var1 = &(this->m_access_list)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)__last._M_node == p_Var1) {
LAB_0021516d:
    auVar14[0] = -((char)local_68 == -1);
    auVar14[1] = -(local_68._1_1_ == -1);
    auVar14[2] = -(local_68._2_1_ == -1);
    auVar14[3] = -(local_68._3_1_ == -1);
    auVar14[4] = -(local_68._4_1_ == -1);
    auVar14[5] = -(local_68._5_1_ == -1);
    auVar14[6] = -(local_68._6_1_ == -1);
    auVar14[7] = -(local_68._7_1_ == -1);
    auVar14[8] = -((char)uStack_60 == -1);
    auVar14[9] = -(uStack_60._1_1_ == -1);
    auVar14[10] = -(uStack_60._2_1_ == -1);
    auVar14[0xb] = -(uStack_60._3_1_ == -1);
    auVar14[0xc] = -(uStack_60._4_1_ == -1);
    auVar14[0xd] = -(uStack_60._5_1_ == -1);
    auVar14[0xe] = -(uStack_60._6_1_ == -1);
    auVar14[0xf] = -(uStack_60._7_1_ == -1);
    if ((ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe | (ushort)(auVar14[0xf] >> 7) << 0xf
                ) == 0xffff) goto LAB_002151d8;
  }
  else {
    local_98 = *(_Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>_>
                 **)(__last._M_node + 1);
    p_Stack_90 = __last._M_node[1]._M_parent;
    uVar6 = 0xf;
    do {
      uVar8 = (ulong)uVar6;
      if (*(char *)((long)&local_98 + uVar8) != '\0') {
        *(char *)((long)&local_98 + uVar8) = *(char *)((long)&local_98 + uVar8) + -1;
        break;
      }
      *(undefined1 *)((long)&local_98 + uVar8) = 0xff;
      bVar10 = uVar6 != 0;
      uVar6 = uVar6 - 1;
    } while (bVar10);
    local_78._M_t = local_98;
    _Var4._M_t = local_78._M_t;
    uStack_70 = p_Stack_90;
    p_Var5 = uStack_70;
    local_78._M_t._0_1_ = (char)local_98;
    local_78._M_t._1_1_ = (char)((ulong)local_98 >> 8);
    local_78._M_t._2_1_ = (char)((ulong)local_98 >> 0x10);
    local_78._M_t._3_1_ = (char)((ulong)local_98 >> 0x18);
    local_78._M_t._4_1_ = (char)((ulong)local_98 >> 0x20);
    local_78._M_t._5_1_ = (char)((ulong)local_98 >> 0x28);
    local_78._M_t._6_1_ = (char)((ulong)local_98 >> 0x30);
    local_78._M_t._7_1_ = (char)((ulong)local_98 >> 0x38);
    uStack_70._0_1_ = (char)p_Stack_90;
    uStack_70._1_1_ = (char)((ulong)p_Stack_90 >> 8);
    uStack_70._2_1_ = (char)((ulong)p_Stack_90 >> 0x10);
    uStack_70._3_1_ = (char)((ulong)p_Stack_90 >> 0x18);
    uStack_70._4_1_ = (char)((ulong)p_Stack_90 >> 0x20);
    uStack_70._5_1_ = (char)((ulong)p_Stack_90 >> 0x28);
    uStack_70._6_1_ = (char)((ulong)p_Stack_90 >> 0x30);
    uStack_70._7_1_ = (char)((ulong)p_Stack_90 >> 0x38);
    auVar11[0] = -((char)local_68 == (char)local_78._M_t);
    auVar11[1] = -(local_68._1_1_ == local_78._M_t._1_1_);
    auVar11[2] = -(local_68._2_1_ == local_78._M_t._2_1_);
    auVar11[3] = -(local_68._3_1_ == local_78._M_t._3_1_);
    auVar11[4] = -(local_68._4_1_ == local_78._M_t._4_1_);
    auVar11[5] = -(local_68._5_1_ == local_78._M_t._5_1_);
    auVar11[6] = -(local_68._6_1_ == local_78._M_t._6_1_);
    auVar11[7] = -(local_68._7_1_ == local_78._M_t._7_1_);
    auVar11[8] = -((char)uStack_60 == (char)uStack_70);
    auVar11[9] = -(uStack_60._1_1_ == uStack_70._1_1_);
    auVar11[10] = -(uStack_60._2_1_ == uStack_70._2_1_);
    auVar11[0xb] = -(uStack_60._3_1_ == uStack_70._3_1_);
    auVar11[0xc] = -(uStack_60._4_1_ == uStack_70._4_1_);
    auVar11[0xd] = -(uStack_60._5_1_ == uStack_70._5_1_);
    auVar11[0xe] = -(uStack_60._6_1_ == uStack_70._6_1_);
    auVar11[0xf] = -(uStack_60._7_1_ == uStack_70._7_1_);
    local_78._M_t = _Var4._M_t;
    uStack_70 = p_Var5;
    if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe | (ushort)(auVar11[0xf] >> 7) << 0xf
                ) == 0xffff) {
      if ((_Rb_tree_header *)__last._M_node != p_Var1) goto LAB_002151d8;
      goto LAB_0021516d;
    }
  }
  if (local_84 != flags) {
    local_98 = local_68;
    p_Stack_90 = uStack_60;
    lVar7 = 0xf;
    do {
      if (lVar7 == -1) break;
      pcVar2 = (char *)((long)&local_98 + lVar7);
      *pcVar2 = *pcVar2 + '\x01';
      lVar7 = lVar7 + -1;
    } while (*pcVar2 == '\0');
    addr._M_elems._8_8_ = p_Stack_90;
    addr._M_elems._0_8_ = local_98;
    range::range((range *)&local_98,addr,local_84);
    local_78._M_t =
         (_Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>_>
          *)this;
    __last = ::std::
             _Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>>
             ::
             _M_insert_unique_<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,std::_Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>>::_Alloc_node>
                       ((_Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>>
                         *)this,__last._M_node,(range *)&local_98,&local_78);
  }
LAB_002151d8:
  if (((_Rb_tree_header *)__last._M_node != p_Var1) &&
     (*(uint32_t *)&__last._M_node[1]._M_left == flags)) {
    ::std::
    _Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>>
    ::erase_abi_cxx11_((_Rb_tree<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range,std::_Identity<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>,std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,16ul>>::range>>
                        *)this,(const_iterator)__last._M_node);
  }
  return;
}

Assistant:

void filter_impl<Addr>::add_rule(Addr first, Addr last, std::uint32_t const flags)
	{
		TORRENT_ASSERT(!m_access_list.empty());
		TORRENT_ASSERT(first < last || first == last);

		auto i = m_access_list.upper_bound(first);
		auto j = m_access_list.upper_bound(last);

		if (i != m_access_list.begin()) --i;

		TORRENT_ASSERT(j != m_access_list.begin());
		TORRENT_ASSERT(j != i);

		std::uint32_t first_access = i->access;
		std::uint32_t last_access = std::prev(j)->access;

		if (i->start != first && first_access != flags)
		{
			i = m_access_list.insert(i, range(first, flags));
		}
		else if (i != m_access_list.begin() && std::prev(i)->access == flags)
		{
			--i;
			first_access = i->access;
		}
		TORRENT_ASSERT(!m_access_list.empty());
		TORRENT_ASSERT(i != m_access_list.end());

		if (i != j) m_access_list.erase(std::next(i), j);
		if (i->start == first)
		{
			// This is an optimization over erasing and inserting a new element
			// here.
			// this const-cast is OK because we know that the new
			// start address will keep the set correctly ordered
			const_cast<Addr&>(i->start) = first;
			const_cast<std::uint32_t&>(i->access) = flags;
		}
		else if (first_access != flags)
		{
			m_access_list.insert(i, range(first, flags));
		}

		if ((j != m_access_list.end()
				&& minus_one(j->start) != last)
			|| (j == m_access_list.end()
				&& last != max_addr<Addr>()))
		{
			TORRENT_ASSERT(j == m_access_list.end() || last < minus_one(j->start));
			if (last_access != flags)
				j = m_access_list.insert(j, range(plus_one(last), last_access));
		}

		if (j != m_access_list.end() && j->access == flags) m_access_list.erase(j);
		TORRENT_ASSERT(!m_access_list.empty());
	}